

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O1

int PostLoopFinalize(VP8EncIterator *it,int ok)

{
  VP8Encoder *enc;
  uint64_t (*pauVar1) [3];
  int i;
  uint64_t (*pauVar2) [3];
  long lVar3;
  long lVar4;
  VP8BitWriter *bw;
  int (*paiVar5) [4];
  
  enc = it->enc_;
  if (ok == 0) {
    ok = 0;
  }
  else if (0 < enc->num_parts_) {
    bw = enc->parts_;
    ok = ok & 1;
    lVar3 = 0;
    do {
      VP8BitWriterFinish(bw);
      if (bw->error_ != 0) {
        ok = 0;
      }
      lVar3 = lVar3 + 1;
      bw = bw + 1;
    } while (lVar3 < enc->num_parts_);
  }
  if (ok == 0) {
    VP8EncFreeBitWriters(enc);
  }
  else {
    if (enc->pic_->stats != (WebPAuxStats *)0x0) {
      pauVar1 = it->bit_count_;
      paiVar5 = enc->residual_bytes_;
      lVar3 = 0;
      do {
        lVar4 = 0;
        pauVar2 = pauVar1;
        do {
          *(ulong *)(*paiVar5 + lVar4) =
               CONCAT44((int)(pauVar2[1][0] + 7 >> 3),(int)((*pauVar2)[0] + 7 >> 3));
          lVar4 = lVar4 + 2;
          pauVar2 = pauVar2 + 2;
        } while (lVar4 != 4);
        lVar3 = lVar3 + 1;
        pauVar1 = (uint64_t (*) [3])(*pauVar1 + 1);
        paiVar5 = paiVar5 + 1;
      } while (lVar3 != 3);
    }
    VP8AdjustFilterStrength(it);
  }
  return ok;
}

Assistant:

static int PostLoopFinalize(VP8EncIterator* const it, int ok) {
  VP8Encoder* const enc = it->enc_;
  if (ok) {      // Finalize the partitions, check for extra errors.
    int p;
    for (p = 0; p < enc->num_parts_; ++p) {
      VP8BitWriterFinish(enc->parts_ + p);
      ok &= !enc->parts_[p].error_;
    }
  }

  if (ok) {      // All good. Finish up.
#if !defined(WEBP_DISABLE_STATS)
    if (enc->pic_->stats != NULL) {  // finalize byte counters...
      int i, s;
      for (i = 0; i <= 2; ++i) {
        for (s = 0; s < NUM_MB_SEGMENTS; ++s) {
          enc->residual_bytes_[i][s] = (int)((it->bit_count_[s][i] + 7) >> 3);
        }
      }
    }
#endif
    VP8AdjustFilterStrength(it);     // ...and store filter stats.
  } else {
    // Something bad happened -> need to do some memory cleanup.
    VP8EncFreeBitWriters(enc);
  }
  return ok;
}